

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O1

double tcdf(double t,int df)

{
  ulong uVar1;
  double x;
  double dVar2;
  
  if (0 < df) {
    dVar2 = (double)df;
    x = dVar2 / (t * t + dVar2);
    dVar2 = ibeta(x,dVar2 * 0.5,0.5);
    dVar2 = 1.0 - dVar2 * 0.5;
    uVar1 = -(ulong)(x == 0.0);
    return (double)(uVar1 & 0x3fe0000000000000 |
                   ~uVar1 & (-(ulong)(t < 0.0) & (ulong)(1.0 - dVar2) |
                            ~-(ulong)(t < 0.0) & (ulong)dVar2));
  }
  printf("Degree Of Freedom should be a positive real integer");
  exit(1);
}

Assistant:

double tcdf(double t, int df) {
	double oup,x,I;
	
	if (df <= 0) {
		printf("Degree Of Freedom should be a positive real integer");
		exit(1);
	}
	
	x = df / (df + t * t);
	
	I = 0.5 * ibeta(x,df / 2.0, 1./2.);
	
	oup = 1. - I;
	
	if ( t < 0.) {
		oup = 1. - oup;
	}
	
	if ( x == 0.) {
		oup = 0.5;
	}
	
	
	return oup;
}